

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3StrAccumReset(StrAccum *p)

{
  if ((p->printfFlags & 4) != 0) {
    if (p->zText != (char *)0x0) {
      sqlite3DbFreeNN(p->db,p->zText);
    }
    p->printfFlags = p->printfFlags & 0xfb;
  }
  p->zText = (char *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3StrAccumReset(StrAccum *p){
  assert( (p->zText==0 || p->zText==p->zBase)==!isMalloced(p) );
  if( isMalloced(p) ){
    sqlite3DbFree(p->db, p->zText);
    p->printfFlags &= ~SQLITE_PRINTF_MALLOCED;
  }
  p->zText = 0;
}